

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseConditionalSections(xmlParserCtxtPtr ctxt)

{
  xmlType xVar1;
  xmlParserInputState xVar2;
  int iVar3;
  unsigned_long uVar4;
  int iVar5;
  void *pvVar6;
  xmlChar *pxVar7;
  xmlChar xVar8;
  void *pvVar9;
  xmlParserErrors error;
  xmlParserInputPtr pxVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  
  if (ctxt->instate == XML_PARSER_EOF) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = (void *)0x0;
    uVar11 = 0;
    uVar12 = 0;
    do {
      xVar1 = ctxt->mlType;
      if (((((xVar1 == XML_TYPE_XML) && (pxVar7 = ctxt->input->cur, *pxVar7 == '<')) &&
           (pxVar7[1] == '!')) && (pxVar7[2] == '[')) ||
         (((xVar1 == XML_TYPE_SML && (pxVar7 = ctxt->input->cur, *pxVar7 == '!')) &&
          (pxVar7[1] == '[')))) {
        pxVar10 = ctxt->input;
        iVar5 = pxVar10->id;
        pxVar7 = pxVar10->cur;
        pxVar10->cur = pxVar7 + (ulong)(xVar1 == XML_TYPE_XML) + 2;
        pxVar10->col = (uint)(xVar1 == XML_TYPE_XML) + pxVar10->col + 2;
        if (pxVar7[(ulong)(xVar1 == XML_TYPE_XML) + 2] == '\0') {
          xmlParserInputGrow(pxVar10,0xfa);
        }
        xmlSkipBlankChars(ctxt);
        pxVar10 = ctxt->input;
        pxVar7 = pxVar10->cur;
        if (*pxVar7 == 'I') {
          if (((pxVar7[1] != 'N') || (pxVar7[2] != 'C')) ||
             ((pxVar7[3] != 'L' ||
              (((pxVar7[4] != 'U' || (pxVar7[5] != 'D')) || (pxVar7[6] != 'E')))))) {
            if (((pxVar7[1] != 'G') || (pxVar7[2] != 'N')) ||
               ((pxVar7[3] != 'O' || ((pxVar7[4] != 'R' || (pxVar7[5] != 'E'))))))
            goto LAB_0016429c;
            pxVar10->cur = pxVar7 + 6;
            pxVar10->col = pxVar10->col + 6;
            if (pxVar7[6] == '\0') {
              xmlParserInputGrow(pxVar10,0xfa);
            }
            xmlSkipBlankChars(ctxt);
            if (*ctxt->input->cur != '[') goto LAB_001642c4;
            if (ctxt->input->id != iVar5) {
              xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                             "All markup of the conditional section is not in the same entity\n");
            }
            xmlNextChar(ctxt);
            xVar2 = ctxt->instate;
            iVar3 = ctxt->disableSAX;
            if (ctxt->recovery == 0) {
              ctxt->disableSAX = 1;
            }
            ctxt->instate = XML_PARSER_IGNORE;
            pxVar10 = ctxt->input;
            pxVar7 = pxVar10->cur;
            xVar8 = *pxVar7;
            if (xVar8 != '\0') {
              lVar13 = 0;
              do {
                xVar1 = ctxt->mlType;
                if ((((xVar8 == '<' && xVar1 == XML_TYPE_XML) && (pxVar7[1] == '!')) &&
                    (pxVar7[2] == '[')) ||
                   ((xVar8 == '!' && xVar1 == XML_TYPE_SML && (pxVar7[1] == '[')))) {
                  pxVar10->cur = pxVar7 + (ulong)(xVar1 == XML_TYPE_XML) + 2;
                  pxVar10->col = pxVar10->col + (uint)(xVar1 == XML_TYPE_XML) + 2;
                  if (pxVar7[(ulong)(xVar1 == XML_TYPE_XML) + 2] == '\0') {
                    xmlParserInputGrow(pxVar10,0xfa);
                  }
                  lVar13 = lVar13 + 1;
                  if (lVar13 == 0) {
                    xmlErrMemory(ctxt,(char *)0x0);
                    goto LAB_001642b3;
                  }
                }
                else if (((xVar8 == ']') && (pxVar7[1] == ']')) &&
                        ((xVar1 == XML_TYPE_SML || (pxVar7[2] == '>')))) {
                  if (lVar13 == 0) break;
                  pxVar10->cur = pxVar7 + (ulong)(xVar1 == XML_TYPE_XML) + 2;
                  pxVar10->col = pxVar10->col + (uint)(xVar1 == XML_TYPE_XML) + 2;
                  if (pxVar7[(ulong)(xVar1 == XML_TYPE_XML) + 2] == '\0') {
                    xmlParserInputGrow(pxVar10,0xfa);
                  }
                  lVar13 = lVar13 + -1;
                }
                else {
                  xmlNextChar(ctxt);
                }
                pxVar10 = ctxt->input;
                pxVar7 = pxVar10->cur;
                xVar8 = *pxVar7;
              } while (xVar8 != '\0');
            }
            ctxt->disableSAX = iVar3;
            ctxt->instate = xVar2;
            if (*pxVar7 != '\0') {
              if (pxVar10->id != iVar5) {
                xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not in the same entity\n");
              }
              pxVar10 = ctxt->input;
              pxVar7 = pxVar10->cur;
              pxVar10->cur = pxVar7 + 3;
              pxVar10->col = pxVar10->col + 3;
              iVar5 = 0;
              if (pxVar7[3] == '\0') {
                xmlParserInputGrow(pxVar10,0xfa);
              }
              goto joined_r0x001642bc;
            }
            xmlFatalErr(ctxt,XML_ERR_CONDSEC_NOT_FINISHED,(char *)0x0);
            goto LAB_001642b3;
          }
          pxVar10->cur = pxVar7 + 7;
          pxVar10->col = pxVar10->col + 7;
          if (pxVar7[7] == '\0') {
            xmlParserInputGrow(pxVar10,0xfa);
          }
          xmlSkipBlankChars(ctxt);
          if (*ctxt->input->cur != '[') {
LAB_001642c4:
            error = XML_ERR_CONDSEC_INVALID;
            goto LAB_001642a4;
          }
          if (ctxt->input->id != iVar5) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "All markup of the conditional section is not in the same entity\n");
          }
          xmlNextChar(ctxt);
          pvVar6 = pvVar9;
          if (uVar12 < uVar11) {
LAB_001642fa:
            *(int *)((long)pvVar6 + uVar12 * 4) = iVar5;
            uVar12 = uVar12 + 1;
            iVar5 = 0;
            pvVar9 = pvVar6;
          }
          else {
            bVar14 = uVar11 == 0;
            uVar11 = uVar11 * 2;
            if (bVar14) {
              uVar11 = 4;
            }
            pvVar6 = (*xmlRealloc)(pvVar9,uVar11 * 4);
            if (pvVar6 != (void *)0x0) goto LAB_001642fa;
            xmlErrMemory(ctxt,(char *)0x0);
            iVar5 = 10;
          }
        }
        else {
LAB_0016429c:
          error = XML_ERR_CONDSEC_INVALID_KEYWORD;
LAB_001642a4:
          xmlFatalErr(ctxt,error,(char *)0x0);
          xmlHaltParser(ctxt);
LAB_001642b3:
          iVar5 = 10;
        }
joined_r0x001642bc:
        if (iVar5 != 0) {
          if (iVar5 != 10) {
            return;
          }
          break;
        }
      }
      else {
        if (uVar12 == 0) {
LAB_00163fed:
          pxVar7 = ctxt->input->cur;
          uVar4 = ctxt->input->consumed;
          xmlParseMarkupDecl(ctxt);
          iVar5 = 0;
          if ((ctxt->input->cur == pxVar7) && ((ulong)(uint)uVar4 == ctxt->input->consumed)) {
            xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
            xmlHaltParser(ctxt);
            iVar5 = 10;
          }
          goto joined_r0x001642bc;
        }
        pxVar7 = ctxt->input->cur;
        if (((*pxVar7 != ']') || (pxVar7[1] != ']')) ||
           ((xVar1 != XML_TYPE_SML && (pxVar7[2] != '>')))) goto LAB_00163fed;
        if (ctxt->input->id != *(int *)((long)pvVar9 + uVar12 * 4 + -4)) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
        }
        uVar12 = uVar12 - 1;
        bVar14 = ctxt->mlType == XML_TYPE_XML;
        pxVar10 = ctxt->input;
        pxVar7 = pxVar10->cur;
        pxVar10->cur = pxVar7 + (ulong)bVar14 + 2;
        pxVar10->col = (uint)bVar14 + pxVar10->col + 2;
        if (pxVar7[(ulong)bVar14 + 2] == '\0') {
          xmlParserInputGrow(pxVar10,0xfa);
        }
      }
      if (uVar12 == 0) break;
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
    } while (ctxt->instate != XML_PARSER_EOF);
  }
  (*xmlFree)(pvVar9);
  return;
}

Assistant:

static void
xmlParseConditionalSections(xmlParserCtxtPtr ctxt) {
    int *inputIds = NULL;
    size_t inputIdsSize = 0;
    size_t depth = 0;

    DEBUG_ENTER(("xmlParseConditionalSections(%s);\n", dbgCtxt(ctxt)));

    while (ctxt->instate != XML_PARSER_EOF) {
        if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
            int id = ctxt->input->id;

            SKIP_MLI(3);	/* '<', '!', '[' */
            SKIP_BLANKS;

            if (CMP7(CUR_PTR, 'I', 'N', 'C', 'L', 'U', 'D', 'E')) {
                SKIP(7);
                SKIP_BLANKS;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                if (inputIdsSize <= depth) {
                    int *tmp;

                    inputIdsSize = (inputIdsSize == 0 ? 4 : inputIdsSize * 2);
                    tmp = (int *) xmlRealloc(inputIds,
                            inputIdsSize * sizeof(int));
                    if (tmp == NULL) {
                        xmlErrMemory(ctxt, NULL);
                        goto error;
                    }
                    inputIds = tmp;
                }
                inputIds[depth] = id;
                depth++;
            } else if (CMP6(CUR_PTR, 'I', 'G', 'N', 'O', 'R', 'E')) {
                int state;
                xmlParserInputState instate;
                size_t ignoreDepth = 0;

                SKIP(6);
                SKIP_BLANKS;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                /*
                 * Parse up to the end of the conditional section but disable
                 * SAX event generating DTD building in the meantime
                 */
                state = ctxt->disableSAX;
                instate = ctxt->instate;
                if (ctxt->recovery == 0) ctxt->disableSAX = 1;
                ctxt->instate = XML_PARSER_IGNORE;

                while (RAW != 0) {
                    if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
                        SKIP_MLI(3);
                        ignoreDepth++;
                        /* Check for integer overflow */
                        if (ignoreDepth == 0) {
                            xmlErrMemory(ctxt, NULL);
                            goto error;
                        }
                    } else if ((RAW == ']') && (NXT(1) == ']') &&
                               (ISSML || (NXT(2) == '>'))) {
                        if (ignoreDepth == 0)
                            break;
                        SKIP_MLI(3);
                        ignoreDepth--;
                    } else {
                        NEXT;
                    }
                }

                ctxt->disableSAX = state;
                ctxt->instate = instate;

		if (RAW == 0) {
		    xmlFatalErr(ctxt, XML_ERR_CONDSEC_NOT_FINISHED, NULL);
                    goto error;
		}
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                SKIP(3);
            } else {
                xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID_KEYWORD, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        } else if ((depth > 0) &&
                   (RAW == ']') && (NXT(1) == ']') && (ISSML || (NXT(2) == '>'))) {
            depth--;
            if (ctxt->input->id != inputIds[depth]) {
                xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not"
                               " in the same entity\n");
            }
            SKIP_MLI(3);
        } else {
            const xmlChar *check = CUR_PTR;
            unsigned int cons = ctxt->input->consumed;

            xmlParseMarkupDecl(ctxt);

            if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
                xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        }

        if (depth == 0)
            break;

        SKIP_BLANKS;
        GROW;
    }

error:
    xmlFree(inputIds);
    RETURN();
}